

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

MemTxResult
subpage_read(uc_struct_conflict15 *uc,void *opaque,hwaddr addr,uint64_t *data,uint len,
            MemTxAttrs attrs)

{
  uint64_t uVar1;
  undefined1 local_48 [4];
  MemTxResult res;
  uint8_t buf [8];
  subpage_t *subpage;
  uint len_local;
  uint64_t *data_local;
  hwaddr addr_local;
  void *opaque_local;
  uc_struct_conflict15 *uc_local;
  MemTxAttrs attrs_local;
  
  buf = (uint8_t  [8])opaque;
  uc_local._4_4_ =
       flatview_read(uc,*(FlatView **)((long)opaque + 0xa0),addr + *(long *)((long)opaque + 0xa8),
                     attrs,local_48,(ulong)len);
  if (uc_local._4_4_ == 0) {
    uVar1 = ldn_le_p(local_48,len);
    *data = uVar1;
    uc_local._4_4_ = 0;
  }
  return uc_local._4_4_;
}

Assistant:

static MemTxResult subpage_read(struct uc_struct *uc, void *opaque, hwaddr addr, uint64_t *data,
                                unsigned len, MemTxAttrs attrs)
{
    subpage_t *subpage = opaque;
    uint8_t buf[8];
    MemTxResult res;

#if defined(DEBUG_SUBPAGE)
    printf("%s: subpage %p len %u addr " TARGET_FMT_plx "\n", __func__,
           subpage, len, addr);
#endif
    res = flatview_read(uc, subpage->fv, addr + subpage->base, attrs, buf, len);
    if (res) {
        return res;
    }
    *data = ldn_p(buf, len);
    return MEMTX_OK;
}